

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::Metadata::MergePartialFromCodedStream(Metadata *this,CodedInputStream *input)

{
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMVar1;
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  byte *pbVar2;
  byte bVar3;
  byte *pbVar4;
  uint8 *puVar5;
  bool bVar6;
  int iVar7;
  uint32 uVar8;
  pair<int,_int> pVar9;
  char *field_name;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  string *psVar13;
  pointer data;
  ArenaStringPtr *this_03;
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parser;
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  
  pMVar1 = &(this->userdefined_).map_;
  this_00 = &this->license_;
  this_01 = &this->author_;
  this_02 = &this->versionstring_;
  this_03 = &this->shortdescription_;
  do {
    pbVar4 = input->buffer_;
    uVar8 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar3 = *pbVar4;
      uVar12 = (ulong)bVar3;
      pbVar2 = pbVar4 + 1;
      uVar11 = (uint)bVar3;
      if ((char)bVar3 < '\x01') {
        uVar8 = (uint)bVar3;
        if ((input->buffer_end_ <= pbVar2) || (uVar8 = uVar11, (~(uint)*pbVar2 & uVar11) < 0x80))
        goto LAB_001d1f07;
        uVar12 = (ulong)((uVar11 + (uint)*pbVar2 * 0x80) - 0x80);
        input->buffer_ = pbVar4 + 2;
      }
      else {
        input->buffer_ = pbVar2;
      }
      uVar12 = uVar12 | 0x100000000;
    }
    else {
LAB_001d1f07:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar12 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar8 | uVar12;
    }
    uVar8 = (uint32)uVar12;
    if ((uVar12 & 0x100000000) == 0) {
LAB_001d1c14:
      if (uVar8 == 0) {
        return true;
      }
      if ((uVar8 & 7) == 4) {
        return true;
      }
      bVar6 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar8);
    }
    else {
      uVar11 = (uint)(uVar12 >> 3) & 0x1fffffff;
      cVar10 = (char)uVar12;
      switch(uVar11) {
      case 1:
        if (cVar10 != '\n') goto LAB_001d1c14;
        psVar13 = this_03->ptr_;
        if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_03,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar13 = this_03->ptr_;
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
        if (!bVar6) goto LAB_001d1f3d;
        data = (this_03->ptr_->_M_dataplus)._M_p;
        iVar7 = (int)this_03->ptr_->_M_string_length;
        field_name = "CoreML.Specification.Metadata.shortDescription";
        break;
      case 2:
        if (cVar10 != '\x12') goto LAB_001d1c14;
        psVar13 = this_02->ptr_;
        if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_02,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar13 = this_02->ptr_;
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
        if (!bVar6) goto LAB_001d1f3d;
        data = (this_02->ptr_->_M_dataplus)._M_p;
        iVar7 = (int)this_02->ptr_->_M_string_length;
        field_name = "CoreML.Specification.Metadata.versionString";
        break;
      case 3:
        if (cVar10 != '\x1a') goto LAB_001d1c14;
        psVar13 = this_01->ptr_;
        if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_01,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar13 = this_01->ptr_;
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
        if (!bVar6) goto LAB_001d1f3d;
        data = (this_01->ptr_->_M_dataplus)._M_p;
        iVar7 = (int)this_01->ptr_->_M_string_length;
        field_name = "CoreML.Specification.Metadata.author";
        break;
      case 4:
        if (cVar10 != '\"') goto LAB_001d1c14;
        psVar13 = this_00->ptr_;
        if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar13 = this_00->ptr_;
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
        if (!bVar6) goto LAB_001d1f3d;
        data = (this_00->ptr_->_M_dataplus)._M_p;
        iVar7 = (int)this_00->ptr_->_M_string_length;
        field_name = "CoreML.Specification.Metadata.license";
        break;
      default:
        if ((uVar11 != 100) || (cVar10 != '\"')) goto LAB_001d1c14;
        local_70.key_._M_dataplus._M_p = (pointer)&local_70.key_.field_2;
        local_70.key_._M_string_length = 0;
        local_70.key_.field_2._M_local_buf[0] = '\0';
        local_70.entry_.ptr_ =
             (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
              *)0x0;
        puVar5 = input->buffer_;
        local_70.mf_ = &this->userdefined_;
        local_70.map_ = pMVar1;
        if ((puVar5 < input->buffer_end_) && (iVar7 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
          input->buffer_ = puVar5 + 1;
LAB_001d1e3f:
          pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,iVar7);
          if ((((long)pVar9 < 0) ||
              (bVar6 = google::protobuf::internal::
                       MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                       ::
                       Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::MergePartialFromCodedStream(&local_70,input), !bVar6)) ||
             (bVar6 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                                (input,pVar9.first), !bVar6)) goto LAB_001d1f31;
          bVar6 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                            (local_70.key_._M_dataplus._M_p,(int)local_70.key_._M_string_length,
                             PARSE,"CoreML.Specification.Metadata.UserDefinedEntry.key");
          if (!bVar6) goto LAB_001d1f31;
          bVar6 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                            (((local_70.value_ptr_)->_M_dataplus)._M_p,
                             (int)(local_70.value_ptr_)->_M_string_length,PARSE,
                             "CoreML.Specification.Metadata.UserDefinedEntry.value");
          iVar7 = 6;
          if (bVar6) {
            iVar7 = 0;
          }
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (-1 < iVar7) goto LAB_001d1e3f;
LAB_001d1f31:
          iVar7 = 6;
          bVar6 = false;
        }
        if (local_70.entry_.ptr_ !=
            (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
             *)0x0) {
          (*((local_70.entry_.ptr_)->super_MessageLite)._vptr_MessageLite[1])();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.key_._M_dataplus._M_p != &local_70.key_.field_2) {
          operator_delete(local_70.key_._M_dataplus._M_p,
                          CONCAT71(local_70.key_.field_2._M_allocated_capacity._1_7_,
                                   local_70.key_.field_2._M_local_buf[0]) + 1);
        }
        if (bVar6 != false) goto LAB_001d1c3c;
        goto LAB_001d1c3f;
      }
      bVar6 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                        (data,iVar7,PARSE,field_name);
    }
    if (bVar6 == false) goto LAB_001d1f3d;
LAB_001d1c3c:
    iVar7 = 0;
LAB_001d1c3f:
  } while (iVar7 == 0);
  bVar6 = true;
  if (iVar7 == 6) {
LAB_001d1f3d:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Metadata::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Metadata)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string shortDescription = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_shortdescription()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->shortdescription().data(), this->shortdescription().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.shortDescription"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string versionString = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_versionstring()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->versionstring().data(), this->versionstring().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.versionString"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string author = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_author()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->author().data(), this->author().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.author"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string license = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_license()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->license().data(), this->license().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.license"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // map<string, string> userDefined = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          Metadata_UserDefinedEntry::Parser< ::google::protobuf::internal::MapFieldLite<
              Metadata_UserDefinedEntry,
              ::std::string, ::std::string,
              ::google::protobuf::internal::WireFormatLite::TYPE_STRING,
              ::google::protobuf::internal::WireFormatLite::TYPE_STRING,
              0 >,
            ::google::protobuf::Map< ::std::string, ::std::string > > parser(&userdefined_);
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
              input, &parser));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            parser.key().data(), parser.key().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.UserDefinedEntry.key"));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            parser.value().data(), parser.value().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Metadata.UserDefinedEntry.value"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Metadata)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Metadata)
  return false;
#undef DO_
}